

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

void gimage::anon_unknown_11::writePNMHeader
               (char *name,char *type,long width,long height,long maxval,float scale)

{
  undefined8 uVar1;
  int iVar2;
  ostream *poVar3;
  void *this;
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  _Ios_Openmode in_EDI;
  long in_R8;
  float in_XMM0_Da;
  failure *ex;
  ofstream out;
  long local_230 [64];
  float local_2c;
  long local_28;
  long local_20;
  long local_18;
  char *local_10;
  _Ios_Openmode local_8;
  
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::ofstream::ofstream(local_230);
  uVar1 = *(undefined8 *)(local_230[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_230 + (int)uVar1);
  std::ofstream::open((char *)local_230,local_8);
  poVar3 = std::operator<<((ostream *)local_230,local_10);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = (ostream *)std::ostream::operator<<(local_230,local_18);
  poVar3 = std::operator<<(poVar3," ");
  this = (void *)std::ostream::operator<<(poVar3,local_20);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  iVar2 = strcmp(local_10,"Pf");
  if (iVar2 != 0) {
    iVar2 = strcmp(local_10,"PF");
    if (iVar2 != 0) {
      poVar3 = (ostream *)std::ostream::operator<<(local_230,local_28);
      std::operator<<(poVar3,"\n");
      goto LAB_0017f3b6;
    }
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_230,local_2c);
  std::operator<<(poVar3,"\n");
LAB_0017f3b6:
  std::ofstream::close();
  std::ofstream::~ofstream(local_230);
  return;
}

Assistant:

void writePNMHeader(const char *name, const char *type, long width,
                    long height, long maxval, float scale)
{
  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    out.open(name, std::ios::binary);
    out << type << std::endl;
    out << width << " " << height << std::endl;

    if (strcmp(type, "Pf") == 0 || strcmp(type, "PF") == 0)
    {
      out << scale << "\n";
    }
    else
    {
      out << maxval << "\n";
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}